

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t line_cols(Terminal *term,termline *ldata)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  wVar2 = term->cols + L'\xfffffffd';
  if (ldata->trusted == false) {
    wVar2 = term->cols;
  }
  wVar2 = ((int)(short)(*(int *)ldata << 10) >> 0xf) + wVar2;
  wVar1 = L'\0';
  if (L'\0' < wVar2) {
    wVar1 = wVar2;
  }
  return wVar1;
}

Assistant:

static int line_cols(Terminal *term, termline *ldata)
{
    int cols = term->cols;
    if (ldata->trusted) {
        cols -= TRUST_SIGIL_WIDTH;
    }
    if (ldata->lattr & LATTR_WRAPPED2)
        cols--;
    if (cols < 0)
        cols = 0;
    return cols;
}